

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall MsFlash50::MsFlash50(MsFlash50 *this,ByteVector *data)

{
  pointer *pprVar1;
  uint uVar2;
  pointer puVar3;
  iterator __position;
  pointer peVar4;
  vector<MsFlash50::region,_std::allocator<MsFlash50::region>_> *this_00;
  ulong uVar5;
  long lVar6;
  pointer peVar7;
  extra local_70;
  ulong local_48;
  vector<MsFlash50::region,_std::allocator<MsFlash50::region>_> *local_40;
  ulong local_38;
  
  local_40 = &this->_regionlist;
  (this->_regionlist).super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_regionlist).super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_extralist).super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_regionlist).super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_extralist).super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_extralist).super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = *(uint *)(puVar3 + 8);
  local_48 = (ulong)uVar2;
  local_38 = (ulong)*(uint *)(puVar3 + 0xc);
  if (0xf < local_48) {
    uVar5 = 0;
    do {
      extra::extra(&local_70,
                   (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start + uVar5 + 0x10);
      std::vector<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>::
      emplace_back<MsFlash50::extra>(&this->_extralist,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70.name._M_dataplus._M_p._4_4_,local_70.name._M_dataplus._M_p._0_4_) !=
          &local_70.name.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70.name._M_dataplus._M_p._4_4_,
                                 local_70.name._M_dataplus._M_p._0_4_),
                        CONCAT44(local_70.name.field_2._M_allocated_capacity._4_4_,
                                 local_70.name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      uVar5 = uVar5 + 0x10;
    } while ((uVar2 & 0xfffffff0) != uVar5);
  }
  this_00 = local_40;
  if (0x1b < (uint)local_38) {
    uVar5 = (ulong)((uint)local_38 >> 2) / 7;
    lVar6 = (long)(int)((uint)local_48 & 0xfffffff0) + 0x28;
    do {
      puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_70.name._M_dataplus._M_p._0_4_ = *(undefined4 *)(puVar3 + lVar6 + -0x18);
      local_70.name._M_dataplus._M_p._4_4_ = *(undefined4 *)(puVar3 + lVar6 + -0x14);
      local_70.name._M_string_length._0_4_ = *(undefined4 *)(puVar3 + lVar6 + -0x10);
      local_70.name._M_string_length._4_4_ = *(undefined4 *)(puVar3 + lVar6 + -0xc);
      local_70.name.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar3 + lVar6 + -8);
      local_70.name.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)(puVar3 + lVar6 + -4);
      local_70.name.field_2._8_4_ = *(undefined4 *)(puVar3 + lVar6);
      __position._M_current =
           (this->_regionlist).
           super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_regionlist).
          super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<MsFlash50::region,_std::allocator<MsFlash50::region>_>::
        _M_realloc_insert<MsFlash50::region>(this_00,__position,(region *)&local_70);
      }
      else {
        (__position._M_current)->lsize = local_70.name._M_string_length._4_4_;
        (__position._M_current)->blksectors = local_70.name.field_2._M_allocated_capacity._0_4_;
        (__position._M_current)->blkbytes = local_70.name.field_2._M_allocated_capacity._4_4_;
        (__position._M_current)->compact = local_70.name.field_2._8_4_;
        (__position._M_current)->type = local_70.name._M_dataplus._M_p._0_4_;
        (__position._M_current)->pstart = local_70.name._M_dataplus._M_p._4_4_;
        (__position._M_current)->psize = (undefined4)local_70.name._M_string_length;
        (__position._M_current)->lsize = local_70.name._M_string_length._4_4_;
        pprVar1 = &(this->_regionlist).
                   super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
      }
      lVar6 = lVar6 + 0x1c;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (g_verbose != 0) {
    puts("MSFLSH50");
    peVar4 = (this->_extralist).
             super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (peVar7 = (this->_extralist).
                  super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl.
                  super__Vector_impl_data._M_start; peVar7 != peVar4; peVar7 = peVar7 + 1) {
      printf("%08x %08x %s\n",(ulong)peVar7->start,(ulong)peVar7->size,
             (peVar7->name)._M_dataplus._M_p);
    }
    std::
    for_each<__gnu_cxx::__normal_iterator<MsFlash50::region*,std::vector<MsFlash50::region,std::allocator<MsFlash50::region>>>,MsFlash50::__normal_iterator(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(MsFlash50::region_const&)_1_>
              ((this->_regionlist).
               super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->_regionlist).
               super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

MsFlash50(const ByteVector& data)
    {
        int extracount= get32le(&data[8])/0x10;
        int regioncount= get32le(&data[12])/0x1C;

        for (int i=0 ; i<extracount ; i++)
            _extralist.push_back(extra(&data[16+16*i]));
        for (int i=0 ; i<regioncount ; i++)
            _regionlist.push_back(region(&data[16+16*extracount+0x1c*i]));

        if (g_verbose) {
            printf("MSFLSH50\n");
            std::for_each(_extralist.begin(), _extralist.end(), [](const extra& e) { e.print(); });
            std::for_each(_regionlist.begin(), _regionlist.end(), [](const region& r) { r.print(); });
        }
    }